

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O1

bool __thiscall
Assimp::PLY::DOM::ParseElementInstanceLists
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          PLYImporter *loader)

{
  Logger *pLVar1;
  ElementInstanceList *p_pcOut;
  ElementInstanceList *this_00;
  PLYImporter *loader_00;
  pointer pcElement;
  
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"PLY::DOM::ParseElementInstanceLists() begin");
  std::vector<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>::
  resize(&this->alElementData,
         ((long)(this->alElements).
                super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->alElements).
                super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
  pcElement = (this->alElements).
              super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>.
              _M_impl.super__Vector_impl_data._M_start;
  if (pcElement !=
      (this->alElements).
      super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_00 = (this->alElementData).
              super__Vector_base<Assimp::PLY::ElementInstanceList,_std::allocator<Assimp::PLY::ElementInstanceList>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (pcElement->eSemantic < EEST_Edge) {
        p_pcOut = (ElementInstanceList *)0x0;
        loader_00 = loader;
      }
      else {
        std::vector<Assimp::PLY::ElementInstance,_std::allocator<Assimp::PLY::ElementInstance>_>::
        resize(&this_00->alInstances,(ulong)pcElement->NumOccur);
        loader_00 = (PLYImporter *)0x0;
        p_pcOut = this_00;
      }
      ElementInstanceList::ParseInstanceList(streamBuffer,buffer,pcElement,p_pcOut,loader_00);
      pcElement = pcElement + 1;
      this_00 = this_00 + 1;
    } while (pcElement !=
             (this->alElements).
             super__Vector_base<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  pLVar1 = DefaultLogger::get();
  Logger::debug(pLVar1,"PLY::DOM::ParseElementInstanceLists() succeeded");
  return true;
}

Assistant:

bool PLY::DOM::ParseElementInstanceLists(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, PLYImporter* loader)
{
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceLists() begin");
  alElementData.resize(alElements.size());

  std::vector<PLY::Element>::const_iterator i = alElements.begin();
  std::vector<PLY::ElementInstanceList>::iterator a = alElementData.begin();

  // parse all element instances
  //construct vertices and faces
  for (; i != alElements.end(); ++i, ++a)
  {
    if ((*i).eSemantic == EEST_Vertex || (*i).eSemantic == EEST_Face || (*i).eSemantic == EEST_TriStrip)
    {
      PLY::ElementInstanceList::ParseInstanceList(streamBuffer, buffer, &(*i), NULL, loader);
    }
    else
    {
      (*a).alInstances.resize((*i).NumOccur);
      PLY::ElementInstanceList::ParseInstanceList(streamBuffer, buffer, &(*i), &(*a), NULL);
    }
  }

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseElementInstanceLists() succeeded");
  return true;
}